

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literals *values)

{
  Type *this_00;
  long lVar1;
  TupleMake *pTVar2;
  Literal *other;
  size_t sVar3;
  Iterator IVar4;
  undefined1 local_c0 [8];
  value_type value;
  Literal local_90;
  Expression *local_78;
  size_t local_70;
  Literals *local_68;
  Literal *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> consts;
  
  lVar1 = ((long)(values->super_SmallVector<wasm::Literal,_1UL>).flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(values->super_SmallVector<wasm::Literal,_1UL>).flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18 +
          (values->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
  if (lVar1 == 1) {
    Literal::Literal(&local_90,(values->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
    pTVar2 = (TupleMake *)makeConstantExpression(this,&local_90);
    Literal::~Literal(&local_90);
  }
  else {
    if (lVar1 == 0) {
      __assert_fail("values.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                    ,0x512,"Expression *wasm::Builder::makeConstantExpression(Literals)");
    }
    auStack_58 = (undefined1  [8])0x0;
    consts.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    consts.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    IVar4 = SmallVector<wasm::Literal,_1UL>::end(&values->super_SmallVector<wasm::Literal,_1UL>);
    local_70 = IVar4.
               super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
               .index;
    local_60 = (values->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
    lVar1 = -0x18;
    this_00 = &value.type;
    local_68 = values;
    for (sVar3 = 0;
        local_70 != sVar3 ||
        IVar4.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .parent != &values->super_SmallVector<wasm::Literal,_1UL>; sVar3 = sVar3 + 1) {
      other = (Literal *)
              ((long)&((local_68->super_SmallVector<wasm::Literal,_1UL>).flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_start)->field_0 + lVar1);
      if (sVar3 == 0) {
        other = local_60;
      }
      Literal::Literal((Literal *)local_c0,other);
      Literal::Literal((Literal *)this_00,(Literal *)local_c0);
      local_78 = makeConstantExpression(this,(Literal *)this_00);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,&local_78
                );
      Literal::~Literal((Literal *)this_00);
      Literal::~Literal((Literal *)local_c0);
      lVar1 = lVar1 + 0x18;
    }
    pTVar2 = makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                       (this,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_58);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58);
  }
  return (Expression *)pTVar2;
}

Assistant:

Expression* makeConstantExpression(Literals values) {
    assert(values.size() > 0);
    if (values.size() == 1) {
      return makeConstantExpression(values[0]);
    } else {
      std::vector<Expression*> consts;
      for (auto value : values) {
        consts.push_back(makeConstantExpression(value));
      }
      return makeTupleMake(consts);
    }
  }